

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  uint uVar1;
  Logger *pLVar2;
  VersionSet *edit;
  uint64_t uVar3;
  uint64_t uVar4;
  ManualCompaction *pMVar5;
  bool bVar6;
  int iVar7;
  FileMetaData *pFVar8;
  VersionEdit *pVVar9;
  char *pcVar10;
  CompactionState *this_00;
  undefined8 uVar11;
  char *local_1e0;
  char *local_1d0;
  char *local_1c0;
  ManualCompaction *m_1;
  undefined1 local_170 [16];
  CompactionState *compact;
  undefined1 local_13c [8];
  LevelSummaryStorage tmp;
  FileMetaData *f;
  Status status;
  string local_b8;
  undefined1 local_91;
  string local_90;
  byte local_69;
  string local_68;
  ManualCompaction *local_48;
  ManualCompaction *m;
  InternalKey manual_end;
  Compaction *pCStack_18;
  bool is_manual;
  Compaction *c;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld(&this->mutex_);
  if (this->imm_ == (MemTable *)0x0) {
    manual_end.rep_.field_2._M_local_buf[0xf] = this->manual_compaction_ != (ManualCompaction *)0x0;
    InternalKey::InternalKey((InternalKey *)&m);
    if ((manual_end.rep_.field_2._M_local_buf[0xf] & 1U) == 0) {
      pCStack_18 = VersionSet::PickCompaction(this->versions_);
    }
    else {
      local_48 = this->manual_compaction_;
      pCStack_18 = VersionSet::CompactRange
                             (this->versions_,local_48->level,local_48->begin,local_48->end);
      local_48->done = pCStack_18 == (Compaction *)0x0;
      if (pCStack_18 != (Compaction *)0x0) {
        iVar7 = Compaction::num_input_files(pCStack_18,0);
        pFVar8 = Compaction::input(pCStack_18,0,iVar7 + -1);
        InternalKey::operator=((InternalKey *)&m,&pFVar8->largest);
      }
      pLVar2 = (this->options_).info_log;
      uVar1 = local_48->level;
      local_69 = 0;
      if (local_48->begin == (InternalKey *)0x0) {
        local_1c0 = "(begin)";
      }
      else {
        InternalKey::DebugString_abi_cxx11_(&local_68,local_48->begin);
        local_69 = 1;
        local_1c0 = (char *)std::__cxx11::string::c_str();
      }
      local_91 = 0;
      if (local_48->end == (InternalKey *)0x0) {
        local_1d0 = "(end)";
      }
      else {
        InternalKey::DebugString_abi_cxx11_(&local_90,local_48->end);
        local_91 = 1;
        local_1d0 = (char *)std::__cxx11::string::c_str();
      }
      status.state_._7_1_ = 0;
      if ((local_48->done & 1U) == 0) {
        InternalKey::DebugString_abi_cxx11_(&local_b8,(InternalKey *)&m);
        status.state_._7_1_ = 1;
        local_1e0 = (char *)std::__cxx11::string::c_str();
      }
      else {
        local_1e0 = "(end)";
      }
      Log(pLVar2,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",(ulong)uVar1,
          local_1c0,local_1d0,local_1e0);
      if ((status.state_._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_b8);
      }
      if ((local_91 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((local_69 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    Status::Status((Status *)&f);
    if (pCStack_18 != (Compaction *)0x0) {
      if (((manual_end.rep_.field_2._M_local_buf[0xf] & 1U) == 0) &&
         (bVar6 = Compaction::IsTrivialMove(pCStack_18), bVar6)) {
        iVar7 = Compaction::num_input_files(pCStack_18,0);
        if (iVar7 != 1) {
          __assert_fail("c->num_input_files(0) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                        ,0x2d9,"void leveldb::DBImpl::BackgroundCompaction()");
        }
        pFVar8 = Compaction::input(pCStack_18,0,0);
        pVVar9 = Compaction::edit(pCStack_18);
        iVar7 = Compaction::level(pCStack_18);
        VersionEdit::RemoveFile(pVVar9,iVar7,pFVar8->number);
        pVVar9 = Compaction::edit(pCStack_18);
        iVar7 = Compaction::level(pCStack_18);
        VersionEdit::AddFile
                  (pVVar9,iVar7 + 1,pFVar8->number,pFVar8->file_size,&pFVar8->smallest,
                   &pFVar8->largest);
        edit = this->versions_;
        pVVar9 = Compaction::edit(pCStack_18);
        VersionSet::LogAndApply
                  ((VersionSet *)(tmp.buffer + 0x5c),(VersionEdit *)edit,(Mutex *)pVVar9);
        Status::operator=((Status *)&f,(Status *)(tmp.buffer + 0x5c));
        Status::~Status((Status *)(tmp.buffer + 0x5c));
        bVar6 = Status::ok((Status *)&f);
        if (!bVar6) {
          RecordBackgroundError(this,(Status *)&f);
        }
        pLVar2 = (this->options_).info_log;
        uVar3 = pFVar8->number;
        iVar7 = Compaction::level(pCStack_18);
        uVar4 = pFVar8->file_size;
        Status::ToString_abi_cxx11_((string *)&compact,(Status *)&f);
        uVar11 = std::__cxx11::string::c_str();
        pcVar10 = VersionSet::LevelSummary(this->versions_,(LevelSummaryStorage *)local_13c);
        Log(pLVar2,"Moved #%lld to level-%d %lld bytes %s: %s\n",uVar3,(ulong)(iVar7 + 1),uVar4,
            uVar11,pcVar10);
        std::__cxx11::string::~string((string *)&compact);
      }
      else {
        this_00 = (CompactionState *)operator_new(0x40);
        CompactionState::CompactionState(this_00,pCStack_18);
        local_170._8_8_ = this_00;
        DoCompactionWork((DBImpl *)local_170,(CompactionState *)this);
        Status::operator=((Status *)&f,(Status *)local_170);
        Status::~Status((Status *)local_170);
        bVar6 = Status::ok((Status *)&f);
        if (!bVar6) {
          RecordBackgroundError(this,(Status *)&f);
        }
        CleanupCompaction(this,(CompactionState *)local_170._8_8_);
        Compaction::ReleaseInputs(pCStack_18);
        RemoveObsoleteFiles(this);
      }
    }
    if (pCStack_18 != (Compaction *)0x0) {
      Compaction::~Compaction(pCStack_18);
      operator_delete(pCStack_18);
    }
    bVar6 = Status::ok((Status *)&f);
    if ((!bVar6) &&
       (bVar6 = std::atomic<bool>::load(&this->shutting_down_,memory_order_acquire), !bVar6)) {
      pLVar2 = (this->options_).info_log;
      Status::ToString_abi_cxx11_((string *)&m_1,(Status *)&f);
      uVar11 = std::__cxx11::string::c_str();
      Log(pLVar2,"Compaction error: %s",uVar11);
      std::__cxx11::string::~string((string *)&m_1);
    }
    if ((manual_end.rep_.field_2._M_local_buf[0xf] & 1U) != 0) {
      pMVar5 = this->manual_compaction_;
      bVar6 = Status::ok((Status *)&f);
      if (!bVar6) {
        pMVar5->done = true;
      }
      if ((pMVar5->done & 1U) == 0) {
        InternalKey::operator=(&pMVar5->tmp_storage,(InternalKey *)&m);
        pMVar5->begin = &pMVar5->tmp_storage;
      }
      this->manual_compaction_ = (ManualCompaction *)0x0;
    }
    Status::~Status((Status *)&f);
    InternalKey::~InternalKey((InternalKey *)&m);
  }
  else {
    CompactMemTable(this);
  }
  return;
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->RemoveFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    RemoveObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}